

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inspect_chunk(LodePNGState *state,size_t pos,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  uchar *chunk_00;
  uchar *data_00;
  bool bVar3;
  uint local_50;
  uint error;
  uint unhandled;
  uchar *data;
  uint chunkLength;
  uchar *chunk;
  size_t insize_local;
  uchar *in_local;
  size_t pos_local;
  LodePNGState *state_local;
  
  chunk_00 = in + pos;
  bVar3 = false;
  local_50 = 0;
  if (insize < pos + 4) {
    state_local._4_4_ = 0x1e;
  }
  else {
    uVar2 = lodepng_chunk_length(chunk_00);
    if (uVar2 < 0x80000000) {
      data_00 = lodepng_chunk_data_const(chunk_00);
      if (in + insize < data_00 + (ulong)uVar2 + 4) {
        state_local._4_4_ = 0x1e;
      }
      else {
        uVar1 = lodepng_chunk_type_equals(chunk_00,"PLTE");
        if (uVar1 == '\0') {
          uVar1 = lodepng_chunk_type_equals(chunk_00,"tRNS");
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals(chunk_00,"bKGD");
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals(chunk_00,"tEXt");
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals(chunk_00,"zTXt");
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals(chunk_00,"iTXt");
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals(chunk_00,"tIME");
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals(chunk_00,"pHYs");
                      if (uVar1 == '\0') {
                        uVar1 = lodepng_chunk_type_equals(chunk_00,"gAMA");
                        if (uVar1 == '\0') {
                          uVar1 = lodepng_chunk_type_equals(chunk_00,"cHRM");
                          if (uVar1 == '\0') {
                            uVar1 = lodepng_chunk_type_equals(chunk_00,"sRGB");
                            if (uVar1 == '\0') {
                              uVar1 = lodepng_chunk_type_equals(chunk_00,"iCCP");
                              bVar3 = uVar1 == '\0';
                              if (!bVar3) {
                                local_50 = readChunk_iCCP(&state->info_png,
                                                          (LodePNGDecompressSettings *)state,data_00
                                                          ,(ulong)uVar2);
                              }
                            }
                            else {
                              local_50 = readChunk_sRGB(&state->info_png,data_00,(ulong)uVar2);
                            }
                          }
                          else {
                            local_50 = readChunk_cHRM(&state->info_png,data_00,(ulong)uVar2);
                          }
                        }
                        else {
                          local_50 = readChunk_gAMA(&state->info_png,data_00,(ulong)uVar2);
                        }
                      }
                      else {
                        local_50 = readChunk_pHYs(&state->info_png,data_00,(ulong)uVar2);
                      }
                    }
                    else {
                      local_50 = readChunk_tIME(&state->info_png,data_00,(ulong)uVar2);
                    }
                  }
                  else {
                    local_50 = readChunk_iTXt(&state->info_png,(LodePNGDecompressSettings *)state,
                                              data_00,(ulong)uVar2);
                  }
                }
                else {
                  local_50 = readChunk_zTXt(&state->info_png,(LodePNGDecompressSettings *)state,
                                            data_00,(ulong)uVar2);
                }
              }
              else {
                local_50 = readChunk_tEXt(&state->info_png,data_00,(ulong)uVar2);
              }
            }
            else {
              local_50 = readChunk_bKGD(&state->info_png,data_00,(ulong)uVar2);
            }
          }
          else {
            local_50 = readChunk_tRNS(&(state->info_png).color,data_00,(ulong)uVar2);
          }
        }
        else {
          local_50 = readChunk_PLTE(&(state->info_png).color,data_00,(ulong)uVar2);
        }
        if ((((local_50 != 0) || (bVar3)) || ((state->decoder).ignore_crc != 0)) ||
           (uVar2 = lodepng_chunk_check_crc(chunk_00), uVar2 == 0)) {
          state_local._4_4_ = local_50;
        }
        else {
          state_local._4_4_ = 0x39;
        }
      }
    }
    else {
      state_local._4_4_ = 0x3f;
    }
  }
  return state_local._4_4_;
}

Assistant:

unsigned lodepng_inspect_chunk(LodePNGState* state, size_t pos,
                               const unsigned char* in, size_t insize) {
  const unsigned char* chunk = in + pos;
  unsigned chunkLength;
  const unsigned char* data;
  unsigned unhandled = 0;
  unsigned error = 0;

  if(pos + 4 > insize) return 30;
  chunkLength = lodepng_chunk_length(chunk);
  if(chunkLength > 2147483647) return 63;
  data = lodepng_chunk_data_const(chunk);
  if(data + chunkLength + 4 > in + insize) return 30;

  if(lodepng_chunk_type_equals(chunk, "PLTE")) {
    error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
    error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
    error = readChunk_bKGD(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
    error = readChunk_tEXt(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
    error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
    error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
    error = readChunk_tIME(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
    error = readChunk_pHYs(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
    error = readChunk_gAMA(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
    error = readChunk_cHRM(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
    error = readChunk_sRGB(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
    error = readChunk_iCCP(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  } else {
    /* unhandled chunk is ok (is not an error) */
    unhandled = 1;
  }

  if(!error && !unhandled && !state->decoder.ignore_crc) {
    if(lodepng_chunk_check_crc(chunk)) return 57; /*invalid CRC*/
  }

  return error;
}